

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::class_<asd::Data<short,_asd::channel<2UL>,_asd::version<0UL>,_asd::container::vec>_>
     ::init_holder(instance *inst,value_and_holder *v_h,holder_type *holder_ptr,void *param_4)

{
  unique_ptr<asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>,std::default_delete<asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>>>
  *this;
  Data<short,_asd::channel<2UL>,_asd::version<0UL>,_asd::container::vec> **ppDVar1;
  void *param_3_local;
  holder_type *holder_ptr_local;
  value_and_holder *v_h_local;
  instance *inst_local;
  
  if (holder_ptr == (holder_type *)0x0) {
    if ((inst->field_0x30 & 1) != 0) {
      this = (unique_ptr<asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>,std::default_delete<asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>>>
              *)detail::value_and_holder::
                holder<std::unique_ptr<asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>,std::default_delete<asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>>>>
                          (v_h);
      ppDVar1 = detail::value_and_holder::
                value_ptr<asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>>
                          (v_h);
      std::
      unique_ptr<asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>,std::default_delete<asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>>>
      ::
      unique_ptr<std::default_delete<asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>>,void>
                (this,*ppDVar1);
      detail::value_and_holder::set_holder_constructed(v_h,true);
    }
  }
  else {
    init_holder_from_existing(v_h,holder_ptr);
    detail::value_and_holder::set_holder_constructed(v_h,true);
  }
  return;
}

Assistant:

static void init_holder(detail::instance *inst,
                            detail::value_and_holder &v_h,
                            const holder_type *holder_ptr,
                            const void * /* dummy -- not enable_shared_from_this<T>) */) {
        if (holder_ptr) {
            init_holder_from_existing(v_h, holder_ptr, std::is_copy_constructible<holder_type>());
            v_h.set_holder_constructed();
        } else if (PYBIND11_SILENCE_MSVC_C4127(detail::always_construct_holder<holder_type>::value)
                   || inst->owned) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(v_h.value_ptr<type>());
            v_h.set_holder_constructed();
        }
    }